

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O1

int av1_get_palette_delta_bits_v(PALETTE_MODE_INFO *pmi,int bit_depth,int *zero_count,int *min_bits)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ushort uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  
  bVar1 = pmi->palette_size[1];
  *min_bits = bit_depth + -4;
  *zero_count = 0;
  uVar3 = 0;
  if (1 < (ulong)bVar1) {
    lVar6 = 0;
    uVar3 = 0;
    do {
      iVar7 = (uint)pmi->palette_colors[lVar6 + 0x11] - (uint)pmi->palette_colors[lVar6 + 0x10];
      uVar2 = (ushort)iVar7;
      uVar4 = -uVar2;
      if (0 < iVar7) {
        uVar4 = uVar2;
      }
      uVar5 = (1 << ((byte)bit_depth & 0x1f)) - (uint)uVar4;
      if ((int)(uint)uVar4 < (int)uVar5) {
        uVar5 = (uint)uVar4;
      }
      if ((int)uVar3 < (int)uVar5) {
        uVar3 = uVar5;
      }
      if (uVar5 == 0) {
        *zero_count = *zero_count + 1;
      }
      lVar6 = lVar6 + 1;
    } while ((ulong)bVar1 - 1 != lVar6);
  }
  uVar5 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  iVar7 = 0;
  if (0 < (int)uVar3) {
    iVar7 = (uVar5 ^ 0xffffffe0) + 0x21;
  }
  if (iVar7 <= *min_bits) {
    iVar7 = *min_bits;
  }
  return iVar7;
}

Assistant:

int av1_get_palette_delta_bits_v(const PALETTE_MODE_INFO *const pmi,
                                 int bit_depth, int *zero_count,
                                 int *min_bits) {
  const int n = pmi->palette_size[1];
  const int max_val = 1 << bit_depth;
  int max_d = 0;
  *min_bits = bit_depth - 4;
  *zero_count = 0;
  for (int i = 1; i < n; ++i) {
    const int delta = pmi->palette_colors[2 * PALETTE_MAX_SIZE + i] -
                      pmi->palette_colors[2 * PALETTE_MAX_SIZE + i - 1];
    const int v = abs(delta);
    const int d = AOMMIN(v, max_val - v);
    if (d > max_d) max_d = d;
    if (d == 0) ++(*zero_count);
  }
  return AOMMAX(av1_ceil_log2(max_d + 1), *min_bits);
}